

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printCurrentTestStarted(TestOutput *this,UtestShell *test)

{
  char *pcVar1;
  ulong uVar2;
  long *in_RSI;
  long *in_RDI;
  
  if (0 < *(int *)((long)in_RDI + 0xc)) {
    (**(code **)(*in_RSI + 0x28))();
    pcVar1 = SimpleString::asCharString((SimpleString *)0x181b6e);
    (**(code **)(*in_RDI + 0x58))(in_RDI,pcVar1);
    SimpleString::~SimpleString((SimpleString *)0x181b94);
  }
  uVar2 = (**(code **)(*in_RSI + 0x30))();
  if ((uVar2 & 1) == 0) {
    (**(code **)(*in_RDI + 0x88))(in_RDI,"!");
  }
  else {
    (**(code **)(*in_RDI + 0x88))(in_RDI,".");
  }
  return;
}

Assistant:

void TestOutput::printCurrentTestStarted(const UtestShell& test)
{
    if (verbose_ > level_quiet) print(test.getFormattedName().asCharString());

    if (test.willRun()) {
       setProgressIndicator(".");
    }
    else {
       setProgressIndicator("!");
    }
}